

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparison_expression.hpp
# Opt level: O2

string * __thiscall
duckdb::ComparisonExpression::ToString<duckdb::BoundComparisonExpression,duckdb::Expression>
          (string *__return_storage_ptr__,ComparisonExpression *this,
          BoundComparisonExpression *entry)

{
  pointer pEVar1;
  ExpressionType type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  allocator local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  string local_30 [32];
  
  ::std::__cxx11::string::string(local_30,"(%s %s %s)",&local_91);
  pEVar1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)&this[1].super_ParsedExpression.super_BaseExpression.alias);
  (*(pEVar1->super_BaseExpression)._vptr_BaseExpression[8])(&local_50,pEVar1);
  ExpressionTypeToOperator_abi_cxx11_
            (&local_70,(duckdb *)(ulong)(this->super_ParsedExpression).super_BaseExpression.type,
             type);
  pEVar1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)&this[1].super_ParsedExpression.super_BaseExpression.alias._M_string_length
                     );
  (*(pEVar1->super_BaseExpression)._vptr_BaseExpression[8])(&local_90,pEVar1);
  StringUtil::Format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (__return_storage_ptr__,(StringUtil *)local_30,&local_50,&local_70,&local_90,in_R9);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string(local_30);
  return __return_storage_ptr__;
}

Assistant:

static string ToString(const T &entry) {
		return StringUtil::Format("(%s %s %s)", entry.left->ToString(),
		                          ExpressionTypeToOperator(entry.GetExpressionType()), entry.right->ToString());
	}